

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

void __thiscall Fl_Tree::draw(Fl_Tree *this)

{
  double dVar1;
  Fl_Scrollbar *this_00;
  int iVar2;
  int iVar3;
  Fl_Tree_Item *pFVar4;
  int iVar5;
  
  iVar2 = draw_tree(this);
  if ((0 < iVar2) &&
     (((this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0)) {
    dVar1 = (this->_vscroll->super_Fl_Slider).super_Fl_Valuator.value_;
    iVar5 = (this->super_Fl_Group).super_Fl_Widget.h_;
    iVar3 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
    iVar2 = (int)dVar1 - iVar2;
    if (iVar2 < 0) {
      Fl_Valuator::value((Fl_Valuator *)this->_vscroll,0.0);
      (*(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[6])();
    }
    else {
      iVar5 = iVar5 - iVar3;
      Fl_Slider::slider_size
                (&this->_vscroll->super_Fl_Slider,(double)((float)iVar5 / (float)(iVar5 + iVar2)));
      this_00 = this->_vscroll;
      (this_00->super_Fl_Slider).super_Fl_Valuator.min = 0.0;
      (this_00->super_Fl_Slider).super_Fl_Valuator.max = (double)iVar2;
      Fl_Scrollbar::value(this_00,iVar2);
    }
    Fl::add_timeout(0.1,redraw_soon,this);
  }
  if (((((this->_prefs)._selectmode == FL_TREE_SELECT_SINGLE_DRAGGABLE) &&
       ((Fl_Tree *)Fl::pushed_ == this)) &&
      (pFVar4 = Fl_Tree_Item::find_clicked(this->_root,&this->_prefs), pFVar4 != (Fl_Tree_Item *)0x0
      )) && (pFVar4 != this->_item_focus)) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
              (fl_graphics_driver,0x38,(long)pFVar4->_xywh[3] % 2 & 0xffffffff);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])();
    return;
  }
  return;
}

Assistant:

void Fl_Tree::draw() {
  int ytoofar = draw_tree();

  // See if we're scrolled below bottom of tree
  //   This can happen if someone just closed a large item.
  //   If so, change scroller as needed.
  //
  if ( _vscroll->visible() && ytoofar > 0 ) {
    int scrollval = _vscroll->value();
    int ch = h() - Fl::box_dh(box());
    int range2 = scrollval - ytoofar;
    int size2 = ch + range2;
    if ( range2 < 0 ) {
      _vscroll->value(0);
      _vscroll->hide();
    } else {
      _vscroll->slider_size(float(ch)/float(size2));
      _vscroll->range(0.0,range2);
      _vscroll->value(range2);
    }
    Fl::add_timeout(.10, redraw_soon, (void*)this);	// use timer to trigger redraw; we can't
  }

  // Draw dragging line
  if (_prefs.selectmode() == FL_TREE_SELECT_SINGLE_DRAGGABLE &&
      Fl::pushed() == this) {

    Fl_Tree_Item *item = _root->find_clicked(_prefs); // item we're on, vertically
    if (item && item != _item_focus) {
      // Are we dropping above or before the target item?
      const int h = Fl::event_y() - item->y();
      const int mid = item->h() / 2;
      const bool before = h < mid;

      fl_color(FL_BLACK);

      int tgt = item->y() + (before ? 0 : item->h());
      fl_line(item->x(), tgt, item->x() + item->w(), tgt);
    }
  }
}